

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.hpp
# Opt level: O1

matrix_type *
nanoNet::Trainer::weightsGradientFromPrevious
          (matrix_type *__return_storage_ptr__,vector_type *bias_gradients,
          vector_type *previous_values)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  allocator_type local_46;
  allocator_type local_45;
  value_type_conflict local_44;
  vector<float,_std::allocator<float>_> local_40;
  
  pfVar1 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_44 = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_40,
             (long)(previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_44,&local_45);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,(long)pfVar1 - (long)pfVar2 >> 2,&local_40,&local_46);
  if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pfVar1 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    pfVar2 = (previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar7 = (long)pfVar3 - (long)pfVar2 >> 2;
    pvVar4 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      if (pfVar3 != pfVar2) {
        lVar5 = *(long *)&pvVar4[lVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        lVar9 = 0;
        do {
          *(float *)(lVar5 + lVar9 * 4) =
               pfVar1[lVar8] * pfVar2[lVar9] + *(float *)(lVar5 + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar6 + (ulong)(lVar6 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

static matrix_type weightsGradientFromPrevious(
        const vector_type& bias_gradients, const vector_type& previous_values)
    {
        matrix_type weights_gradients(
            bias_gradients.size(), vector_type(previous_values.size(), 0.0f));

        for (std::size_t i = 0; i < bias_gradients.size(); ++i)
            for (std::size_t j = 0; j < previous_values.size(); ++j)
                weights_gradients[i][j] += bias_gradients[i] * previous_values[j];

        return weights_gradients;
    }